

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBAdd(uint8_t *src_argb0,int src_stride_argb0,uint8_t *src_argb1,int src_stride_argb1,
           uint8_t *dst_argb,int dst_stride_argb,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *ARGBAddRow;
  int y;
  code *pcVar2;
  int local_38;
  int local_34;
  long local_30;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = ARGBAddRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
     (((int)(uint)ARGBAddRow < 1 || (y == 0)))) {
    local_4 = -1;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    if (y < 0) {
      y = -y;
      local_30 = in_R8 + (y + -1) * in_R9D;
      local_34 = -in_R9D;
    }
    local_24 = in_ECX;
    local_14 = in_ESI;
    if (((in_ESI == (uint)ARGBAddRow << 2) && (in_ECX == (uint)ARGBAddRow << 2)) &&
       (local_34 == (uint)ARGBAddRow << 2)) {
      ARGBAddRow._0_4_ = y * (uint)ARGBAddRow;
      y = 1;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = ARGBAddRow_Any_SSE2, ((uint)ARGBAddRow & 3) == 0)) {
      pcVar2 = ARGBAddRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = ARGBAddRow_Any_AVX2, ((uint)ARGBAddRow & 7) == 0)) {
      pcVar2 = ARGBAddRow_AVX2;
    }
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < y; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,(uint)ARGBAddRow);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
      local_30 = local_30 + local_34;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBAdd(const uint8_t* src_argb0,
            int src_stride_argb0,
            const uint8_t* src_argb1,
            int src_stride_argb1,
            uint8_t* dst_argb,
            int dst_stride_argb,
            int width,
            int height) {
  int y;
  void (*ARGBAddRow)(const uint8_t* src0, const uint8_t* src1, uint8_t* dst,
                     int width) = ARGBAddRow_C;
  if (!src_argb0 || !src_argb1 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb0 == width * 4 && src_stride_argb1 == width * 4 &&
      dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb0 = src_stride_argb1 = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBADDROW_SSE2) && (defined(_MSC_VER) && !defined(__clang__))
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBAddRow = ARGBAddRow_SSE2;
  }
#endif
#if defined(HAS_ARGBADDROW_SSE2) && !(defined(_MSC_VER) && !defined(__clang__))
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBAddRow = ARGBAddRow_Any_SSE2;
    if (IS_ALIGNED(width, 4)) {
      ARGBAddRow = ARGBAddRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBAddRow = ARGBAddRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBAddRow = ARGBAddRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBAddRow = ARGBAddRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBAddRow = ARGBAddRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBADDROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBAddRow = ARGBAddRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBAddRow = ARGBAddRow_MSA;
    }
  }
#endif

  // Add plane
  for (y = 0; y < height; ++y) {
    ARGBAddRow(src_argb0, src_argb1, dst_argb, width);
    src_argb0 += src_stride_argb0;
    src_argb1 += src_stride_argb1;
    dst_argb += dst_stride_argb;
  }
  return 0;
}